

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O2

int AddWordToVocab(char *word)

{
  long lVar1;
  longlong lVar2;
  vocab_word *__ptr;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  
  sVar4 = strlen(word);
  uVar3 = (int)sVar4 + 1;
  sVar4 = 100;
  if (uVar3 < 100) {
    sVar4 = (size_t)uVar3;
  }
  pcVar5 = (char *)calloc(sVar4,1);
  lVar2 = vocab_size;
  vocab[vocab_size].word = pcVar5;
  strcpy(vocab[lVar2].word,word);
  __ptr = vocab;
  vocab[vocab_size].cn = 0;
  lVar1 = vocab_size + 1;
  lVar7 = vocab_size + 3;
  vocab_size = lVar1;
  if (vocab_max_size <= lVar7) {
    vocab_max_size = vocab_max_size + 1000;
    vocab = (vocab_word *)realloc(__ptr,vocab_max_size * 0x28);
  }
  uVar3 = GetWordHash(word);
  while (vocab_hash[uVar3] != -1) {
    uVar3 = uVar3 + 1;
    if (uVar3 == 30000000) {
      uVar3 = 0;
    }
  }
  iVar6 = (int)vocab_size + -1;
  vocab_hash[uVar3] = iVar6;
  return iVar6;
}

Assistant:

int AddWordToVocab(char *word) {
  unsigned int hash, length = strlen(word) + 1;
  if (length > MAX_STRING) length = MAX_STRING;
  vocab[vocab_size].word = (char *)calloc(length, sizeof(char));
  strcpy(vocab[vocab_size].word, word);
  vocab[vocab_size].cn = 0;
  vocab_size++;
  // Reallocate memory if needed
  if (vocab_size + 2 >= vocab_max_size) {
    vocab_max_size += 1000;
    vocab = (struct vocab_word *)realloc(vocab, vocab_max_size * sizeof(struct vocab_word));
  }
  hash = GetWordHash(word);
  while (vocab_hash[hash] != -1) hash = (hash + 1) % vocab_hash_size;
  vocab_hash[hash] = vocab_size - 1;
  return vocab_size - 1;
}